

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O2

bool __thiscall QSslKey::operator==(QSslKey *this,QSslKey *other)

{
  bool bVar1;
  bool bVar2;
  KeyAlgorithm KVar3;
  KeyAlgorithm KVar4;
  KeyType KVar5;
  KeyType KVar6;
  int iVar7;
  int iVar8;
  HANDLE pvVar9;
  HANDLE pvVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_80;
  QArrayDataPointer<char> local_68;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isNull(this);
  bVar2 = isNull(other);
  if (!bVar1) {
    if (bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        bVar1 = isNull(this);
        return bVar1;
      }
      goto LAB_0022f5a8;
    }
    KVar3 = algorithm(this);
    KVar4 = algorithm(other);
    if (KVar3 == KVar4) {
      KVar5 = type(this);
      KVar6 = type(other);
      if (KVar5 == KVar6) {
        iVar7 = length(this);
        iVar8 = length(other);
        if (iVar7 == iVar8) {
          KVar3 = algorithm(this);
          if (KVar3 == Opaque) {
            pvVar9 = handle(this);
            pvVar10 = handle(other);
            bVar2 = pvVar9 == pvVar10;
          }
          else {
            local_68.d = (Data *)0x0;
            local_68.ptr = (char *)0x0;
            local_68.size = 0;
            toDer((QByteArray *)&local_50,this,(QByteArray *)&local_68);
            local_98.d = (Data *)0x0;
            local_98.ptr = (char *)0x0;
            local_98.size = 0;
            toDer((QByteArray *)&local_80,other,(QByteArray *)&local_98);
            bVar2 = ::operator==((QByteArray *)&local_50,(QByteArray *)&local_80);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
          }
          goto LAB_0022f56b;
        }
      }
    }
    bVar2 = false;
  }
LAB_0022f56b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_0022f5a8:
  __stack_chk_fail();
}

Assistant:

bool QSslKey::operator==(const QSslKey &other) const
{
    if (isNull())
        return other.isNull();
    if (other.isNull())
        return isNull();
    if (algorithm() != other.algorithm())
        return false;
    if (type() != other.type())
        return false;
    if (length() != other.length())
        return false;
    if (algorithm() == QSsl::Opaque)
        return handle() == other.handle();
    return toDer() == other.toDer();
}